

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad4d_avx2.c
# Opt level: O3

void aom_sad128x128x4d_avx2(uint8_t *src,int src_stride,uint8_t **ref,int ref_stride,uint32_t *res)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint8_t *puVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int iVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  puVar7 = *ref;
  puVar10 = ref[1];
  puVar11 = ref[2];
  puVar8 = ref[3];
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  iVar12 = 0;
  auVar14 = ZEXT1664((undefined1  [16])0x0);
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  do {
    uVar9 = 0xffffffffffffffe0;
    do {
      auVar1 = *(undefined1 (*) [32])(src + uVar9 + 0x20);
      auVar3 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar7 + uVar9 + 0x20));
      auVar3 = vpaddd_avx2(auVar16._0_32_,auVar3);
      auVar16 = ZEXT3264(auVar3);
      auVar4 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar10 + uVar9 + 0x20));
      auVar4 = vpaddd_avx2(auVar15._0_32_,auVar4);
      auVar15 = ZEXT3264(auVar4);
      auVar5 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar11 + uVar9 + 0x20));
      auVar6 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar8 + uVar9 + 0x20));
      auVar1 = vpaddd_avx2(auVar14._0_32_,auVar5);
      auVar14 = ZEXT3264(auVar1);
      auVar5 = vpaddd_avx2(auVar13._0_32_,auVar6);
      auVar13 = ZEXT3264(auVar5);
      uVar9 = uVar9 + 0x20;
    } while (uVar9 < 0x60);
    src = src + src_stride;
    puVar7 = puVar7 + ref_stride;
    puVar10 = puVar10 + ref_stride;
    puVar11 = puVar11 + ref_stride;
    puVar8 = puVar8 + ref_stride;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 0x80);
  auVar3 = vshufps_avx(auVar3,auVar4,0x88);
  auVar1 = vshufps_avx(auVar1,auVar5,0x88);
  auVar1 = vphaddd_avx2(auVar3,auVar1);
  auVar2 = vpaddd_avx(auVar1._16_16_,auVar1._0_16_);
  *(undefined1 (*) [16])res = auVar2;
  return;
}

Assistant:

static AOM_FORCE_INLINE void aom_sadMxNx4d_avx2(
    int M, int N, const uint8_t *src, int src_stride,
    const uint8_t *const ref[4], int ref_stride, uint32_t res[4]) {
  __m256i src_reg, ref0_reg, ref1_reg, ref2_reg, ref3_reg;
  __m256i sum_ref0, sum_ref1, sum_ref2, sum_ref3;
  int i, j;
  const uint8_t *ref0, *ref1, *ref2, *ref3;

  ref0 = ref[0];
  ref1 = ref[1];
  ref2 = ref[2];
  ref3 = ref[3];
  sum_ref0 = _mm256_setzero_si256();
  sum_ref2 = _mm256_setzero_si256();
  sum_ref1 = _mm256_setzero_si256();
  sum_ref3 = _mm256_setzero_si256();

  for (i = 0; i < N; i++) {
    for (j = 0; j < M; j += 32) {
      // load src and all refs
      src_reg = _mm256_loadu_si256((const __m256i *)(src + j));
      ref0_reg = _mm256_loadu_si256((const __m256i *)(ref0 + j));
      ref1_reg = _mm256_loadu_si256((const __m256i *)(ref1 + j));
      ref2_reg = _mm256_loadu_si256((const __m256i *)(ref2 + j));
      ref3_reg = _mm256_loadu_si256((const __m256i *)(ref3 + j));

      // sum of the absolute differences between every ref-i to src
      ref0_reg = _mm256_sad_epu8(ref0_reg, src_reg);
      ref1_reg = _mm256_sad_epu8(ref1_reg, src_reg);
      ref2_reg = _mm256_sad_epu8(ref2_reg, src_reg);
      ref3_reg = _mm256_sad_epu8(ref3_reg, src_reg);
      // sum every ref-i
      sum_ref0 = _mm256_add_epi32(sum_ref0, ref0_reg);
      sum_ref1 = _mm256_add_epi32(sum_ref1, ref1_reg);
      sum_ref2 = _mm256_add_epi32(sum_ref2, ref2_reg);
      sum_ref3 = _mm256_add_epi32(sum_ref3, ref3_reg);
    }
    src += src_stride;
    ref0 += ref_stride;
    ref1 += ref_stride;
    ref2 += ref_stride;
    ref3 += ref_stride;
  }

  aggregate_and_store_sum(res, &sum_ref0, &sum_ref1, &sum_ref2, &sum_ref3);
}